

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator*=(TPZFMatrix<Fad<float>_> *this,Fad<float> *value)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  float *pfVar5;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  Fad<float> *pFVar9;
  long lVar10;
  Fad<float> *pFVar11;
  
  lVar10 = (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol *
           (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
  if (0 < lVar10) {
    pFVar9 = this->fElem;
    pFVar11 = pFVar9 + lVar10;
    do {
      uVar3 = (value->dx_).num_elts;
      uVar7 = (ulong)uVar3;
      uVar4 = (pFVar9->dx_).num_elts;
      uVar8 = (ulong)uVar4;
      fVar1 = value->val_;
      if (uVar7 == 0) {
        if ((uVar8 != 0) && (0 < (int)uVar4)) {
          pfVar5 = (pFVar9->dx_).ptr_to_data;
          uVar7 = 0;
          do {
            pfVar5[uVar7] = pfVar5[uVar7] * fVar1;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
      }
      else {
        pfVar5 = (value->dx_).ptr_to_data;
        if (uVar8 == 0) {
          (pFVar9->dx_).num_elts = uVar3;
          uVar8 = uVar7 * 4;
          if ((int)uVar3 < 0) {
            uVar8 = 0xffffffffffffffff;
          }
          pfVar6 = (float *)operator_new__(uVar8);
          (pFVar9->dx_).ptr_to_data = pfVar6;
          if (0 < (int)uVar3) {
            fVar2 = pFVar9->val_;
            uVar8 = 0;
            do {
              pfVar6[uVar8] = pfVar5[uVar8] * fVar2;
              uVar8 = uVar8 + 1;
            } while (uVar7 != uVar8);
          }
        }
        else if (0 < (int)uVar4) {
          pfVar6 = (pFVar9->dx_).ptr_to_data;
          uVar7 = 0;
          do {
            pfVar6[uVar7] = pFVar9->val_ * pfVar5[uVar7] + pfVar6[uVar7] * fVar1;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
      }
      pFVar9->val_ = fVar1 * pFVar9->val_;
      pFVar9 = pFVar9 + 1;
    } while (pFVar9 < pFVar11);
  }
  return this;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator*=( const TVar value ) {
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    TVar * dst = fElem, *dstlast = dst+size;
    while ( dst < dstlast ) *dst++ *= value;
    return( *this );
}